

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void Eigen::internal::
     triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<1,_0,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1U,_-1,_false>
     ::run(triangular_dense_assignment_kernel<1,_0,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long lVar1;
  MatrixTypeNested pMVar2;
  long col;
  long id;
  long row;
  
  pMVar2 = ((kernel->
            super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
            ).m_dstExpr)->m_matrix;
  for (col = 0; col < (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols; col = col + 1) {
    lVar1 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    id = lVar1;
    if (col <= lVar1) {
      id = col;
    }
    row = id;
    if (col < lVar1) {
      row = id + 1;
      triangular_dense_assignment_kernel<1,_0,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignDiagonalCoeff(kernel,id);
    }
    for (; pMVar2 = ((kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     ).m_dstExpr)->m_matrix,
        row < (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows; row = row + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeff(&kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    ,row,col);
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(Kernel &kernel)
  {
    for(Index j = 0; j < kernel.cols(); ++j)
    {
      Index maxi = numext::mini(j, kernel.rows());
      Index i = 0;
      if (((Mode&Lower) && SetOpposite) || (Mode&Upper))
      {
        for(; i < maxi; ++i)
          if(Mode&Upper) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
      else
        i = maxi;
      
      if(i<kernel.rows()) // then i==j
        kernel.assignDiagonalCoeff(i++);
      
      if (((Mode&Upper) && SetOpposite) || (Mode&Lower))
      {
        for(; i < kernel.rows(); ++i)
          if(Mode&Lower) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
    }
  }